

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O0

IVec2 __thiscall
vkt::memory::anon_unknown_0::findImageSizeWxHx4(anon_unknown_0 *this,VkDeviceSize size)

{
  ulong uVar1;
  VkDeviceSize h;
  VkDeviceSize w;
  VkDeviceSize texelCount;
  VkDeviceSize maxTextureSize;
  VkDeviceSize size_local;
  
  uVar1 = size >> 2;
  h = 1;
  while( true ) {
    if (0xfff < h || uVar1 <= h) {
      tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,-1,-1);
      return (IVec2)(int  [2])this;
    }
    if ((uVar1 % h == 0) && (uVar1 / h < 0x1000)) break;
    h = h + 1;
  }
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this,(int)h,(int)(uVar1 / h));
  return (IVec2)(int  [2])this;
}

Assistant:

IVec2 findImageSizeWxHx4 (vk::VkDeviceSize size)
{
	const vk::VkDeviceSize	maxTextureSize	= 4096;
	vk::VkDeviceSize		texelCount		= size / 4;

	DE_ASSERT((size % 4) == 0);

	// \todo [2016-03-09 mika] Could probably be faster?
	for (vk::VkDeviceSize w = 1; w < maxTextureSize && w < texelCount; w++)
	{
		const vk::VkDeviceSize	h	= texelCount / w;

		if ((texelCount  % w) == 0 && h < maxTextureSize)
			return IVec2((int)w, (int)h);
	}

	DE_FATAL("Invalid size");
	return IVec2(-1, -1);
}